

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::eval_selection_vec2(ShaderEvalContext *c)

{
  undefined8 uVar1;
  Vector<float,_2> *v;
  Vector<float,_2> local_38;
  Vector<float,_2> local_30;
  Vector<float,_2> local_28;
  VecAccess<float,_4,_2> local_20;
  
  uVar1 = *(undefined8 *)c->in[1].m_data;
  local_30.m_data[1] = (float)uVar1;
  local_30.m_data[0] = (float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)(c->in[2].m_data + 1);
  local_38.m_data[1] = (float)uVar1;
  local_38.m_data[0] = (float)((ulong)uVar1 >> 0x20);
  v = &local_38;
  if (0.0 < c->in[0].m_data[2]) {
    v = &local_30;
  }
  tcu::Vector<float,_2>::Vector(&local_28,v);
  local_20.m_vector = &c->color;
  local_20.m_index[0] = 1;
  local_20.m_index[1] = 2;
  tcu::VecAccess<float,_4,_2>::operator=(&local_20,&local_28);
  return;
}

Assistant:

void eval_selection_vec2	(ShaderEvalContext& c) { c.color.yz()	= selection(c.in[0].z() > 0.0f,		c.in[1].swizzle(1, 0),			c.in[2].swizzle(2, 1)); }